

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O0

void Bdc_ManDecPrint_rec(Bdc_Man_t *p,Bdc_Fun_t *pNode)

{
  int iVar1;
  Bdc_Fun_t *pBVar2;
  Bdc_Fun_t *p_00;
  Bdc_Fun_t *pBVar3;
  Bdc_Fun_t *pNode1;
  Bdc_Fun_t *pNode0;
  Bdc_Fun_t *pNode_local;
  Bdc_Man_t *p_local;
  
  if (pNode->Type == 2) {
    iVar1 = Bdc_FunId(p,pNode);
    printf("%c",(ulong)(iVar1 + 0x60));
  }
  else {
    if (pNode->Type != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcCore.c"
                    ,0x102,"void Bdc_ManDecPrint_rec(Bdc_Man_t *, Bdc_Fun_t *)");
    }
    pBVar2 = Bdc_FuncFanin0(pNode);
    p_00 = Bdc_FuncFanin1(pNode);
    iVar1 = Bdc_IsComplement(pBVar2);
    if (iVar1 != 0) {
      printf("!");
    }
    iVar1 = Bdc_IsComplement(pBVar2);
    if ((iVar1 != 0) && (pBVar3 = Bdc_Regular(pBVar2), pBVar3->Type != 2)) {
      printf("(");
    }
    pBVar3 = Bdc_Regular(pBVar2);
    Bdc_ManDecPrint_rec(p,pBVar3);
    iVar1 = Bdc_IsComplement(pBVar2);
    if ((iVar1 != 0) && (pBVar2 = Bdc_Regular(pBVar2), pBVar2->Type != 2)) {
      printf(")");
    }
    iVar1 = Bdc_IsComplement(p_00);
    if (iVar1 != 0) {
      printf("!");
    }
    iVar1 = Bdc_IsComplement(p_00);
    if ((iVar1 != 0) && (pBVar2 = Bdc_Regular(p_00), pBVar2->Type != 2)) {
      printf("(");
    }
    pBVar2 = Bdc_Regular(p_00);
    Bdc_ManDecPrint_rec(p,pBVar2);
    iVar1 = Bdc_IsComplement(p_00);
    if ((iVar1 != 0) && (pBVar2 = Bdc_Regular(p_00), pBVar2->Type != 2)) {
      printf(")");
    }
  }
  return;
}

Assistant:

void Bdc_ManDecPrint_rec( Bdc_Man_t * p, Bdc_Fun_t * pNode )
{
    if ( pNode->Type == BDC_TYPE_PI )
        printf( "%c", 'a' + Bdc_FunId(p,pNode) - 1 );
    else if ( pNode->Type == BDC_TYPE_AND )
    {
        Bdc_Fun_t * pNode0 = Bdc_FuncFanin0( pNode );
        Bdc_Fun_t * pNode1 = Bdc_FuncFanin1( pNode );

        if ( Bdc_IsComplement(pNode0) )
            printf( "!" );
        if ( Bdc_IsComplement(pNode0) && Bdc_Regular(pNode0)->Type != BDC_TYPE_PI )
            printf( "(" );
        Bdc_ManDecPrint_rec( p, Bdc_Regular(pNode0) );
        if ( Bdc_IsComplement(pNode0) && Bdc_Regular(pNode0)->Type != BDC_TYPE_PI )
            printf( ")" );

        if ( Bdc_IsComplement(pNode1) )
            printf( "!" );
        if ( Bdc_IsComplement(pNode1) && Bdc_Regular(pNode1)->Type != BDC_TYPE_PI )
            printf( "(" );
        Bdc_ManDecPrint_rec( p, Bdc_Regular(pNode1) );
        if ( Bdc_IsComplement(pNode1) && Bdc_Regular(pNode1)->Type != BDC_TYPE_PI )
            printf( ")" );
    }
    else assert( 0 );
}